

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.hpp
# Opt level: O2

size_t __thiscall
Diligent::DeviceContextVkImpl::GetDynamicBufferOffset
          (DeviceContextVkImpl *this,BufferVkImpl *pBuffer,bool VerifyAllocation)

{
  pointer pMVar1;
  char (*in_RCX) [19];
  char (*in_R8) [34];
  ulong uVar2;
  string msg;
  
  if (pBuffer == (BufferVkImpl *)0x0) {
    FormatString<char[26],char[19]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x5cce7f,in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetDynamicBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
               ,0x295);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((pBuffer->m_VulkanBuffer).m_VkObject == (VkBuffer_T *)0x0) {
    if (VerifyAllocation) {
      DvpVerifyDynamicAllocation(this,pBuffer);
    }
    uVar2 = (ulong)(pBuffer->super_BufferBase<Diligent::EngineVkImplTraits>).m_DynamicBufferId;
    if (uVar2 == 0xffffffff) {
      FormatString<char[17],char_const*,char[34]>
                (&msg,(Diligent *)"Dynamic buffer \'",
                 (char (*) [17])
                 &(pBuffer->super_BufferBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                  .m_Desc,(char **)"\' does not have dynamic buffer ID",in_R8);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetDynamicBufferOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
                 ,0x2a2);
      std::__cxx11::string::~string((string *)&msg);
    }
    pMVar1 = (this->m_MappedBuffers).
             super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar2 < (ulong)(((long)(this->m_MappedBuffers).
                               super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1) / 0x28)) {
      return pMVar1[uVar2].Allocation.AlignedOffset;
    }
  }
  return 0;
}

Assistant:

__forceinline size_t DeviceContextVkImpl::GetDynamicBufferOffset(const BufferVkImpl* pBuffer, bool VerifyAllocation)
{
    VERIFY_EXPR(pBuffer != nullptr);

    if (pBuffer->m_VulkanBuffer != VK_NULL_HANDLE)
        return 0;

#ifdef DILIGENT_DEVELOPMENT
    if (VerifyAllocation)
    {
        DvpVerifyDynamicAllocation(pBuffer);
    }
#endif

    const Uint32 DynamicBufferId = pBuffer->GetDynamicBufferId();
    VERIFY(DynamicBufferId != ~0u, "Dynamic buffer '", pBuffer->GetDesc().Name, "' does not have dynamic buffer ID");
    return DynamicBufferId < m_MappedBuffers.size() ?
        m_MappedBuffers[DynamicBufferId].Allocation.AlignedOffset :
        0;
}